

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O2

void HeapOp(void)

{
  uint uVar1;
  Chuck *pCVar2;
  byte bVar3;
  void *raw;
  Heap *heap;
  Chuck *chuck;
  Chuck *chuck_00;
  Chuck *pCVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  
  raw = malloc(0x1000);
  heap = CreateHeap(raw,0x1000);
  pCVar2 = heap->head;
  if (pCVar2 == heap->last) {
    uVar5 = (ulong)(*(uint *)&pCVar2->field_0x4 >> 1);
    if (((&pCVar2->field_0x4)[uVar5 * 8] & 1) == 0) {
      if (pCVar2->prev == (ChuckLayout *)0x0) {
        if (pCVar2->next == (ChuckLayout *)0x0) {
          if (*(uint *)&pCVar2->field_0x4 < 2) {
            __assertion = "GetSize(heap->head) > 0";
            uVar1 = 0x51;
          }
          else {
            bVar3 = MatchSorted(uVar5 << 3);
            for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
              if (heap->exact[uVar5] != (Chuck *)0x0) {
                __assertion = "!heap->exact[i]";
                uVar1 = 0x55;
                goto LAB_00101934;
              }
              if (bVar3 == uVar5) {
                if (heap->sorted[bVar3] != heap->head) {
                  __assertion = "heap->sorted[i] == heap->head";
                  uVar1 = 0x5c;
                  goto LAB_00101934;
                }
              }
              else if (heap->sorted[uVar5] != (Chuck *)0x0) {
                __assertion = "!heap->sorted[i]";
                uVar1 = 0x58;
                goto LAB_00101934;
              }
            }
            pCVar2 = heap->head;
            MoveOut(heap,pCVar2);
            if (heap->head == (Chuck *)0x0) {
              if (heap->last == (Chuck *)0x0) {
                MoveIn(heap,pCVar2);
                if (heap->head == pCVar2) {
                  if (heap->last == pCVar2) {
                    MoveOut(heap,pCVar2);
                    chuck = SplitIfWorthy(pCVar2,0x80);
                    chuck_00 = SplitIfWorthy(chuck,0x40);
                    SplitIfWorthy(chuck_00,0x100);
                    MoveIn(heap,pCVar2);
                    MoveIn(heap,chuck_00);
                    if (heap->head == pCVar2) {
                      if (pCVar2->prev == (ChuckLayout *)0x0) {
                        if (pCVar2->next == chuck_00) {
                          if (chuck_00->next == (ChuckLayout *)0x0) {
                            if (heap->last == chuck_00) {
                              pCVar4 = FindSmallestFitInHeap(heap,0);
                              if (pCVar4 == pCVar2) {
                                uVar5 = 0;
                                do {
                                  uVar6 = (ulong)(*(uint *)&chuck_00->field_0x4 & 0xfffffffe) * 4;
                                  if (uVar6 < uVar5) {
                                    pCVar4 = FindSmallestFitInHeap(heap,uVar6 + 8);
                                    if (pCVar4 != (Chuck *)0x0) {
                                      __assert_fail(
                                                  "FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x80,"void HeapOp()");
                                    }
                                    MoveIn(heap,chuck);
                                    if (heap->head != chuck) {
                                      __assert_fail("heap->head == ck2",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x83,"void HeapOp()");
                                    }
                                    if (chuck->next != pCVar2) {
                                      __assert_fail("ck2->next == ck1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x84,"void HeapOp()");
                                    }
                                    MoveOut(heap,pCVar2);
                                    if (chuck->next == chuck_00) {
                                      MoveOut(heap,chuck_00);
                                      if (chuck->next != (ChuckLayout *)0x0) {
                                        __assert_fail("ck2->next == NULL",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x88,"void HeapOp()");
                                      }
                                      if (heap->last == chuck) {
                                        free(raw);
                                        return;
                                      }
                                      __assert_fail("heap->last == ck2",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x89,"void HeapOp()");
                                    }
                                    __assert_fail("ck2->next == ck3",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                                                  ,0x86,"void HeapOp()");
                                  }
                                  uVar1 = *(uint *)&pCVar2->field_0x4;
                                  pCVar4 = FindSmallestFitInHeap(heap,uVar5);
                                  if ((ulong)(uVar1 & 0xfffffffe) << 2 < uVar5) {
                                    if (pCVar4 != chuck_00) {
                                      __assertion = "FindSmallestFitInHeap(heap, size) == ck3";
                                      uVar1 = 0x7d;
                                      goto LAB_00101934;
                                    }
                                  }
                                  else if (pCVar4 != pCVar2) {
                                    __assertion = "FindSmallestFitInHeap(heap, size) == ck1";
                                    uVar1 = 0x79;
                                    goto LAB_00101934;
                                  }
                                  uVar5 = uVar5 + 8;
                                } while( true );
                              }
                              __assertion = "FindSmallestFitInHeap(heap, 0) == ck1";
                              uVar1 = 0x74;
                            }
                            else {
                              __assertion = "heap->last == ck3";
                              uVar1 = 0x73;
                            }
                          }
                          else {
                            __assertion = "ck3->next == NULL";
                            uVar1 = 0x72;
                          }
                        }
                        else {
                          __assertion = "ck1->next == ck3";
                          uVar1 = 0x71;
                        }
                      }
                      else {
                        __assertion = "ck1->prev == NULL";
                        uVar1 = 0x70;
                      }
                    }
                    else {
                      __assertion = "heap->head == ck1";
                      uVar1 = 0x6f;
                    }
                  }
                  else {
                    __assertion = "heap->last == ck";
                    uVar1 = 0x66;
                  }
                }
                else {
                  __assertion = "heap->head == ck";
                  uVar1 = 0x65;
                }
              }
              else {
                __assertion = "!heap->last";
                uVar1 = 99;
              }
            }
            else {
              __assertion = "!heap->head";
              uVar1 = 0x62;
            }
          }
        }
        else {
          __assertion = "!heap->head->next";
          uVar1 = 0x50;
        }
      }
      else {
        __assertion = "!heap->head->prev";
        uVar1 = 0x4f;
      }
    }
    else {
      __assertion = "!GetUsed(heap->head)";
      uVar1 = 0x4e;
    }
  }
  else {
    __assertion = "heap->head == heap->last";
    uVar1 = 0x4d;
  }
LAB_00101934:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                ,uVar1,"void HeapOp()");
}

Assistant:

void HeapOp()
{
    Raw raw = malloc(sizeof(uint8_t) * 4096);
    Heap *heap = CreateHeap(raw, 4096);

    assert(heap->head == heap->last);
    assert(!GetUsed(heap->head));
    assert(!heap->head->prev);
    assert(!heap->head->next);
    assert(GetSize(heap->head) > 0);
    uint8_t slot = MatchSorted(GetSize(heap->head));
    for (int i = 0; i < 64; i += 1)
    {
        assert(!heap->exact[i]);
        if (i != slot)
        {
            assert(!heap->sorted[i]);
        }
        else
        {
            assert(heap->sorted[i] == heap->head);
        }
    }

    Chuck *ck = heap->head;
    MoveOut(heap, ck);
    assert(!heap->head);
    assert(!heap->last);
    MoveIn(heap, ck);
    assert(heap->head == ck);
    assert(heap->last == ck);

    MoveOut(heap, ck);
    Chuck *ck1 = ck;
    Chuck *ck2 = SplitIfWorthy(ck1, 128);
    Chuck *ck3 = SplitIfWorthy(ck2, 64);
    SplitIfWorthy(ck3, 256);
    MoveIn(heap, ck1);
    MoveIn(heap, ck3);
    assert(heap->head == ck1);
    assert(ck1->prev == NULL);
    assert(ck1->next == ck3);
    assert(ck3->next == NULL);
    assert(heap->last == ck3);
    assert(FindSmallestFitInHeap(heap, 0) == ck1);
    for (Size size = 0; size <= GetSize(ck3); size += 8)
    {
        if (size <= GetSize(ck1))
        {
            assert(FindSmallestFitInHeap(heap, size) == ck1);
        }
        else
        {
            assert(FindSmallestFitInHeap(heap, size) == ck3);
        }
    }
    assert(FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL);

    MoveIn(heap, ck2);
    assert(heap->head == ck2);
    assert(ck2->next == ck1);
    MoveOut(heap, ck1);
    assert(ck2->next == ck3);
    MoveOut(heap, ck3);
    assert(ck2->next == NULL);
    assert(heap->last == ck2);

    free(raw);
}